

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMethod
          (DescriptorBuilder *this,MethodDescriptor *method,MethodDescriptorProto *proto)

{
  bool bVar1;
  MethodOptions *pMVar2;
  DescriptorBuilder *this_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  MethodDescriptor *in_RSI;
  long *in_RDI;
  Symbol SVar3;
  Symbol output_type;
  string *in_stack_000000f0;
  ErrorLocation in_stack_000000fc;
  FileDescriptor *in_stack_00000100;
  string *in_stack_00000108;
  DescriptorBuilder *in_stack_00000110;
  Symbol input_type;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 build_it;
  undefined8 in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  DescriptorBuilder *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string local_c8 [32];
  string local_a8 [32];
  Symbol local_88;
  string *in_stack_ffffffffffffff90;
  string local_68 [4];
  ErrorLocation in_stack_ffffffffffffff9c;
  Message *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  DescriptorBuilder *in_stack_ffffffffffffffb0;
  Descriptor *in_stack_ffffffffffffffb8;
  LazyDescriptor *in_stack_ffffffffffffffc0;
  Symbol local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  MethodDescriptor *local_10;
  
  build_it = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(in_RSI + 0x58) == 0) {
    pMVar2 = MethodOptions::default_instance();
    *(MethodOptions **)(local_10 + 0x58) = pMVar2;
  }
  MethodDescriptorProto::input_type_abi_cxx11_((MethodDescriptorProto *)0x4add1c);
  MethodDescriptor::full_name_abi_cxx11_(local_10);
  SVar3 = LookupSymbol(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0
                       ,(PlaceholderType)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                       (ResolveMode)in_stack_fffffffffffffed8,(bool)build_it);
  local_28.field_1 = SVar3.field_1;
  local_28.type = SVar3.type;
  bVar1 = Symbol::IsNull(&local_28);
  if (bVar1) {
    if ((*(byte *)(*in_RDI + 0x29) & 1) == 0) {
      MethodDescriptor::full_name_abi_cxx11_(local_10);
      MethodDescriptorProto::input_type_abi_cxx11_((MethodDescriptorProto *)0x4addb7);
      AddNotDefinedError(in_stack_00000110,in_stack_00000108,(Message *)in_stack_00000100,
                         in_stack_000000fc,in_stack_000000f0);
    }
    else {
      MethodDescriptorProto::input_type_abi_cxx11_((MethodDescriptorProto *)0x4addf3);
      internal::LazyDescriptor::SetLazy
                ((LazyDescriptor *)in_stack_00000110,in_stack_00000108,in_stack_00000100);
    }
  }
  else if (local_28.type == MESSAGE) {
    internal::LazyDescriptor::Set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    MethodDescriptor::full_name_abi_cxx11_(local_10);
    in_stack_ffffffffffffff00 = local_18;
    MethodDescriptorProto::input_type_abi_cxx11_((MethodDescriptorProto *)0x4ade40);
    in_stack_ffffffffffffff08 = local_68;
    std::operator+((char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    AddError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string(local_68);
  }
  this_00 = (DescriptorBuilder *)
            MethodDescriptorProto::output_type_abi_cxx11_((MethodDescriptorProto *)0x4adf27);
  MethodDescriptor::full_name_abi_cxx11_(local_10);
  SVar3 = LookupSymbol(this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                       (PlaceholderType)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                       (ResolveMode)in_stack_fffffffffffffed8,(bool)build_it);
  local_88.field_1 = SVar3.field_1;
  local_88.type = SVar3.type;
  bVar1 = Symbol::IsNull(&local_88);
  if (bVar1) {
    if ((*(byte *)(*in_RDI + 0x29) & 1) == 0) {
      MethodDescriptor::full_name_abi_cxx11_(local_10);
      MethodDescriptorProto::output_type_abi_cxx11_((MethodDescriptorProto *)0x4adfc2);
      AddNotDefinedError(in_stack_00000110,in_stack_00000108,(Message *)in_stack_00000100,
                         in_stack_000000fc,in_stack_000000f0);
    }
    else {
      MethodDescriptorProto::output_type_abi_cxx11_((MethodDescriptorProto *)0x4adffe);
      internal::LazyDescriptor::SetLazy
                ((LazyDescriptor *)in_stack_00000110,in_stack_00000108,in_stack_00000100);
    }
  }
  else if (local_88.type == MESSAGE) {
    internal::LazyDescriptor::Set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    __rhs = MethodDescriptor::full_name_abi_cxx11_(local_10);
    MethodDescriptorProto::output_type_abi_cxx11_((MethodDescriptorProto *)0x4ae04b);
    std::operator+((char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(local_18,(char *)__rhs);
    AddError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMethod(MethodDescriptor* method,
                                        const MethodDescriptorProto& proto) {
  if (method->options_ == nullptr) {
    method->options_ = &MethodOptions::default_instance();
  }

  Symbol input_type =
      LookupSymbol(proto.input_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (input_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::INPUT_TYPE,
                         proto.input_type());
    } else {
      method->input_type_.SetLazy(proto.input_type(), file_);
    }
  } else if (input_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::INPUT_TYPE,
             "\"" + proto.input_type() + "\" is not a message type.");
  } else {
    method->input_type_.Set(input_type.descriptor);
  }

  Symbol output_type =
      LookupSymbol(proto.output_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (output_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::OUTPUT_TYPE,
                         proto.output_type());
    } else {
      method->output_type_.SetLazy(proto.output_type(), file_);
    }
  } else if (output_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::OUTPUT_TYPE,
             "\"" + proto.output_type() + "\" is not a message type.");
  } else {
    method->output_type_.Set(output_type.descriptor);
  }
}